

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<bool,_const_type_safe::boolean_&> * __thiscall
Catch::ExprLhs<bool>::operator==
          (BinaryExpr<bool,_const_type_safe::boolean_&> *__return_storage_ptr__,ExprLhs<bool> *this,
          boolean *rhs)

{
  bool bVar1;
  bool comparisonResult;
  StringRef local_30;
  boolean *local_20;
  boolean *rhs_local;
  ExprLhs<bool> *this_local;
  
  local_20 = rhs;
  rhs_local = (boolean *)this;
  this_local = (ExprLhs<bool> *)__return_storage_ptr__;
  comparisonResult = compareEqual<bool,type_safe::boolean>(&this->m_lhs,rhs);
  bVar1 = this->m_lhs;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<bool,_const_type_safe::boolean_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,(bool)(bVar1 & 1),local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }